

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerProfiledNewScArray(Lowerer *this,JitProfilingInstr *arrInstr)

{
  LowererMD *this_00;
  Instr *pIVar1;
  IntConstOpnd *opndArg;
  AddrOpnd *opndArg_00;
  Opnd *opndArg_01;
  HelperCallOpnd *newSrc;
  
  pIVar1 = (arrInstr->super_Instr).m_prev;
  this_00 = &this->m_lowererMD;
  opndArg = IR::Opnd::CreateProfileIdOpnd(arrInstr->profileId,this->m_func);
  LowererMD::LoadHelperArgument(this_00,&arrInstr->super_Instr,&opndArg->super_Opnd);
  opndArg_00 = CreateFunctionBodyOpnd(this,(arrInstr->super_Instr).m_func);
  LowererMD::LoadHelperArgument(this_00,&arrInstr->super_Instr,&opndArg_00->super_Opnd);
  opndArg_01 = IR::Instr::UnlinkSrc1(&arrInstr->super_Instr);
  LowererMD::LoadHelperArgument(this_00,&arrInstr->super_Instr,opndArg_01);
  newSrc = IR::HelperCallOpnd::New(HelperProfiledNewScArray,this->m_func);
  IR::Instr::SetSrc1(&arrInstr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(this_00,&arrInstr->super_Instr,0);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerProfiledNewScArray(IR::JitProfilingInstr* arrInstr)
{
    IR::Instr *instrPrev = arrInstr->m_prev;

    /*
        JavascriptArray *ProfilingHelpers::ProfiledNewScArray(
            const uint length,
            FunctionBody *const functionBody,
            const ProfileId profileId)
    */

    m_lowererMD.LoadHelperArgument(arrInstr, IR::Opnd::CreateProfileIdOpnd(arrInstr->profileId, m_func));
    m_lowererMD.LoadHelperArgument(arrInstr, CreateFunctionBodyOpnd(arrInstr->m_func));
    m_lowererMD.LoadHelperArgument(arrInstr, arrInstr->UnlinkSrc1());
    arrInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledNewScArray, m_func));
    m_lowererMD.LowerCall(arrInstr, 0);

    return instrPrev;
}